

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Real Omega_h::repro_sum(Reals *a)

{
  Alloc *pAVar1;
  int iVar2;
  ulong uVar3;
  double unit;
  Real RVar4;
  Int128 fixpt_sum;
  Write<double> local_48;
  Write<double> local_38;
  Int128 local_28;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  RVar4 = 0.0;
  if ((int)(uVar3 >> 3) != 0) {
    begin_code("repro_sum",(char *)0x0);
    Write<double>::Write(&local_38,&a->write_);
    iVar2 = max_exponent((Reals *)&local_38);
    Write<double>::~Write(&local_38);
    unit = ldexp(1.0,iVar2 + -0x34);
    Write<double>::Write(&local_48,&a->write_);
    local_28 = int128_sum((Reals *)&local_48,unit);
    Write<double>::~Write(&local_48);
    RVar4 = Int128::to_double(&local_28,unit);
    end_code();
  }
  return RVar4;
}

Assistant:

Real repro_sum(Reals a) {
  if (a.size() == 0) {
    return 0.0;
  }
  begin_code("repro_sum");
  int expo = max_exponent(a);
  auto const init = ArithTraits<int>::min();
  if (expo == init) return 0.0;
  double unit = exp2(double(expo - MANTISSA_BITS));
  Int128 fixpt_sum = int128_sum(a, unit);
  double ret = fixpt_sum.to_double(unit);
  end_code();
  return ret;
}